

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_RepeatedFieldSmartSet_MultipleMatches_Test
::TestBody(MessageDifferencerTest_RepeatedFieldSmartSet_MultipleMatches_Test *this)

{
  RepeatedPtrFieldBase *this_00;
  bool bVar1;
  TestField *pTVar2;
  char *message;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  string diff_report;
  TestField elem3_2;
  TestField elem3_1;
  TestField elem2_2;
  TestField elem2_1;
  TestField elem1_1;
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencer differencer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_550;
  Message local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_540;
  AssertHelper local_538;
  undefined1 local_530 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  string local_510;
  TestField local_4f0;
  TestField local_498;
  TestField local_440;
  TestField local_3e8;
  TestField local_390;
  undefined1 local_338 [184];
  undefined1 local_280 [184];
  MessageDifferencer local_1c8;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_280,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_338,(Arena *)0x0);
  proto2_unittest::TestField::TestField(&local_390,(Arena *)0x0);
  proto2_unittest::TestField::TestField(&local_3e8,(Arena *)0x0);
  proto2_unittest::TestField::TestField(&local_498,(Arena *)0x0);
  proto2_unittest::TestField::TestField(&local_440,(Arena *)0x0);
  proto2_unittest::TestField::TestField(&local_4f0,(Arena *)0x0);
  local_390.field_0._impl_.b_ = 1;
  local_390.field_0._56_8_ = &DAT_100000001;
  local_390.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_390.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 0xe;
  local_3e8.field_0._impl_.b_ = 2;
  local_440.field_0._impl_.b_ = 0;
  local_3e8.field_0._56_8_ = 0x200000002;
  local_3e8.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_3e8.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 0xe;
  local_440.field_0._56_8_ = 0x200000002;
  local_440.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_440.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 0xe;
  local_498.field_0._impl_.a_ = 3;
  local_4f0.field_0._impl_.a_ = 3;
  local_498.field_0._impl_.b_ = 3;
  local_4f0.field_0._impl_.b_ = 0;
  local_498.field_0._impl_.c_ = 3;
  local_498.field_0._impl_._has_bits_.has_bits_[0] =
       (HasBits<1>)((uint)local_498.field_0._impl_._has_bits_.has_bits_[0] | 0xe);
  local_4f0.field_0._impl_.c_ = 3;
  local_4f0.field_0._impl_._has_bits_.has_bits_[0] =
       (HasBits<1>)((uint)local_4f0.field_0._impl_._has_bits_.has_bits_[0] | 0xe);
  this_00 = (RepeatedPtrFieldBase *)(local_280 + 0x70);
  pTVar2 = (TestField *)
           protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (this_00,Arena::DefaultConstruct<proto2_unittest::TestField>);
  proto2_unittest::TestField::CopyFrom(pTVar2,&local_390);
  pTVar2 = (TestField *)
           protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (this_00,Arena::DefaultConstruct<proto2_unittest::TestField>);
  proto2_unittest::TestField::CopyFrom(pTVar2,&local_3e8);
  pTVar2 = (TestField *)
           protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (this_00,Arena::DefaultConstruct<proto2_unittest::TestField>);
  proto2_unittest::TestField::CopyFrom(pTVar2,&local_498);
  pTVar2 = (TestField *)
           protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_338 + 0x70),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  proto2_unittest::TestField::CopyFrom(pTVar2,&local_440);
  pTVar2 = (TestField *)
           protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_338 + 0x70),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  proto2_unittest::TestField::CopyFrom(pTVar2,&local_4f0);
  local_510._M_string_length = 0;
  local_510.field_2._M_local_buf[0] = '\0';
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  util::MessageDifferencer::MessageDifferencer(&local_1c8);
  util::MessageDifferencer::ReportDifferencesToString(&local_1c8,&local_510);
  util::MessageDifferencer::set_repeated_field_comparison(&local_1c8,AS_SMART_SET);
  bVar1 = util::MessageDifferencer::Compare(&local_1c8,(Message *)local_280,(Message *)local_338);
  local_548.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)!bVar1;
  local_540 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_550);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_530,(internal *)&local_548,(AssertionResult *)0x126d6fd,"true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_538,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x6ce,(char *)CONCAT71(local_530._1_7_,local_530[0]));
    testing::internal::AssertHelper::operator=(&local_538,(Message *)&local_550);
    testing::internal::AssertHelper::~AssertHelper(&local_538);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_530._1_7_,local_530[0]) != &local_520) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_530._1_7_,local_530[0]),local_520._M_allocated_capacity + 1)
      ;
    }
    if (local_550._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_550._M_head_impl + 8))();
    }
  }
  if (local_540 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_540,local_540);
  }
  testing::internal::CmpHelperEQ<char[110],std::__cxx11::string>
            ((internal *)local_530,
             "\"modified: rm[1].b -> rm[0].b: 2 -> 0\\n\" \"modified: rm[2].b -> rm[1].b: 3 -> 0\\n\" \"deleted: rm[0]: { c: 1 a: 1 b: 1 }\\n\""
             ,"diff_report",
             (char (*) [110])
             "modified: rm[1].b -> rm[0].b: 2 -> 0\nmodified: rm[2].b -> rm[1].b: 3 -> 0\ndeleted: rm[0]: { c: 1 a: 1 b: 1 }\n"
             ,&local_510);
  if (local_530[0] == (internal)0x0) {
    testing::Message::Message(&local_548);
    if (local_528 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_528->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_550,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x6d3,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_550,&local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_550);
    if ((long *)CONCAT71(local_548.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_548.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_548.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_548.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_528 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_528,local_528);
  }
  util::MessageDifferencer::~MessageDifferencer(&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,
                    CONCAT71(local_510.field_2._M_allocated_capacity._1_7_,
                             local_510.field_2._M_local_buf[0]) + 1);
  }
  proto2_unittest::TestField::~TestField(&local_4f0);
  proto2_unittest::TestField::~TestField(&local_440);
  proto2_unittest::TestField::~TestField(&local_498);
  proto2_unittest::TestField::~TestField(&local_3e8);
  proto2_unittest::TestField::~TestField(&local_390);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_338);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_280);
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldSmartSet_MultipleMatches) {
  // Create the testing protos
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  proto2_unittest::TestField elem1_1, elem2_1, elem3_1;
  proto2_unittest::TestField elem2_2, elem3_2;

  // Only one field is different for each pair of elements
  elem1_1.set_a(1);
  elem1_1.set_b(1);
  elem1_1.set_c(1);
  elem2_1.set_a(2);
  elem2_2.set_a(2);
  elem2_1.set_b(2);
  elem2_2.set_b(0);
  elem2_1.set_c(2);
  elem2_2.set_c(2);
  elem3_1.set_a(3);
  elem3_2.set_a(3);
  elem3_1.set_b(3);
  elem3_2.set_b(0);
  elem3_1.set_c(3);
  elem3_2.set_c(3);

  // In this testcase, elem1_1 will match with elem2_2 first and then get
  // reverted because elem2_1 matches with elem2_2 later.
  *msg1.add_rm() = elem1_1;
  *msg1.add_rm() = elem2_1;
  *msg1.add_rm() = elem3_1;
  *msg2.add_rm() = elem2_2;
  *msg2.add_rm() = elem3_2;

  std::string diff_report;
  util::MessageDifferencer differencer;
  differencer.ReportDifferencesToString(&diff_report);
  differencer.set_repeated_field_comparison(
      util::MessageDifferencer::AS_SMART_SET);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "modified: rm[1].b -> rm[0].b: 2 -> 0\n"
      "modified: rm[2].b -> rm[1].b: 3 -> 0\n"
      "deleted: rm[0]: { c: 1 a: 1 b: 1 }\n",
      diff_report);
}